

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  size_t sVar3;
  uint32_t *puVar4;
  bool bVar5;
  SmallVector<unsigned_int,_8UL> *pSVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  long lVar10;
  bool bVar11;
  
  uVar1 = (blocks->_M_h)._M_bucket_count;
  uVar7 = (ulong)block % uVar1;
  p_Var8 = (blocks->_M_h)._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != block)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var2[1]._M_nxt == block)) goto LAB_002c0f84;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_002c0f84:
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    pSVar6 = spirv_cross::CFG::get_succeeding_edges(cfg,block);
    if ((pSVar6->super_VectorView<unsigned_int>).buffer_size == 0) {
      bVar11 = true;
    }
    else {
      pSVar6 = spirv_cross::CFG::get_succeeding_edges(cfg,block);
      sVar3 = (pSVar6->super_VectorView<unsigned_int>).buffer_size;
      bVar11 = sVar3 != 0;
      if (bVar11) {
        puVar4 = (pSVar6->super_VectorView<unsigned_int>).ptr;
        bVar5 = exists_unaccessed_path_to_return(cfg,*puVar4,blocks);
        if (!bVar5) {
          lVar10 = 4;
          do {
            bVar5 = sVar3 << 2 == lVar10;
            bVar11 = !bVar5;
            if (bVar5) {
              return bVar11;
            }
            bVar5 = exists_unaccessed_path_to_return
                              (cfg,*(uint32_t *)((long)puVar4 + lVar10),blocks);
            lVar10 = lVar10 + 4;
          } while (!bVar5);
        }
      }
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
		if (exists_unaccessed_path_to_return(cfg, succ, blocks))
			return true;

	return false;
}